

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

Ptr __thiscall MobileElementManager::GetAttached(MobileElementManager *this,int index)

{
  long lVar1;
  range_error *this_00;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Ptr PVar2;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 0x28);
  if ((ulong)(long)in_EDX <
      (ulong)(*(long *)(CONCAT44(in_register_00000034,index) + 0x30) - lVar1 >> 5)) {
    std::__shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar1 + (long)in_EDX * 0x20 + 0x10));
    PVar2.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    PVar2.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (Ptr)PVar2.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"Polymerase index out of range.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

Polymer::Ptr MobileElementManager::GetAttached(int index) {
  if (index >= polymerases_.size()) {
    throw std::range_error("Polymerase index out of range.");
  }
  return polymerases_[index].second;
}